

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O0

void __thiscall
deqp::egl::ConfigFilter::setValues
          (ConfigFilter *this,
          vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
          *values)

{
  EGLenum name_00;
  size_type sVar1;
  reference pvVar2;
  EGLint value;
  EGLenum name;
  size_t ndx;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *values_local
  ;
  ConfigFilter *this_local;
  
  _value = 0;
  while( true ) {
    sVar1 = std::
            vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
            size(values);
    if (sVar1 <= _value) break;
    pvVar2 = std::
             vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
             operator[](values,_value);
    name_00 = pvVar2->first;
    pvVar2 = std::
             vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
             operator[](values,_value);
    setValue(this,name_00,pvVar2->second);
    _value = _value + 1;
  }
  return;
}

Assistant:

void setValues (std::vector<std::pair<EGLenum, EGLint> > values)
	{
		for (size_t ndx = 0; ndx < values.size(); ndx++)
		{
			const EGLenum	name	= values[ndx].first;
			const EGLint	value	= values[ndx].second;

			setValue(name, value);
		}
	}